

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.cpp
# Opt level: O0

ConversionResult
llvm::ConvertUTF16toUTF32
          (UTF16 **sourceStart,UTF16 *sourceEnd,UTF32 **targetStart,UTF32 *targetEnd,
          ConversionFlags flags)

{
  UTF32 *pUVar1;
  uint uVar2;
  UTF32 *pUVar3;
  UTF16 *oldSource;
  UTF32 ch2;
  UTF32 ch;
  UTF32 *target;
  UTF16 *source;
  ConversionResult result;
  ConversionFlags flags_local;
  UTF32 *targetEnd_local;
  UTF32 **targetStart_local;
  UTF16 *sourceEnd_local;
  UTF16 **sourceStart_local;
  
  source._0_4_ = conversionOK;
  target = (UTF32 *)*sourceStart;
  _ch2 = *targetStart;
  do {
    pUVar1 = target;
    if (sourceEnd <= target) {
LAB_0028a54a:
      *sourceStart = (UTF16 *)pUVar1;
      *targetStart = _ch2;
      return (ConversionResult)source;
    }
    pUVar3 = (UTF32 *)((long)target + 2);
    oldSource._4_4_ = (uint)(ushort)*target;
    if ((oldSource._4_4_ < 0xd800) || (0xdbff < oldSource._4_4_)) {
      target = pUVar3;
      if ((flags == strictConversion) && ((0xdbff < oldSource._4_4_ && (oldSource._4_4_ < 0xe000))))
      {
        source._0_4_ = sourceIllegal;
        goto LAB_0028a54a;
      }
    }
    else {
      if (sourceEnd <= pUVar3) {
        source._0_4_ = sourceExhausted;
        goto LAB_0028a54a;
      }
      uVar2 = (uint)*(ushort *)pUVar3;
      if ((uVar2 < 0xdc00) || (0xdfff < uVar2)) {
        target = pUVar3;
        if (flags == strictConversion) {
          source._0_4_ = sourceIllegal;
          goto LAB_0028a54a;
        }
      }
      else {
        oldSource._4_4_ = (oldSource._4_4_ - 0xd800) * 0x400 + uVar2 + 0x2400;
        target = target + 1;
      }
    }
    if (targetEnd <= _ch2) {
      source._0_4_ = targetExhausted;
      goto LAB_0028a54a;
    }
    *_ch2 = oldSource._4_4_;
    _ch2 = _ch2 + 1;
  } while( true );
}

Assistant:

ConversionResult ConvertUTF16toUTF32 (
        const UTF16** sourceStart, const UTF16* sourceEnd,
        UTF32** targetStart, UTF32* targetEnd, ConversionFlags flags) {
    ConversionResult result = conversionOK;
    const UTF16* source = *sourceStart;
    UTF32* target = *targetStart;
    UTF32 ch, ch2;
    while (source < sourceEnd) {
        const UTF16* oldSource = source; /*  In case we have to back up because of target overflow. */
        ch = *source++;
        /* If we have a surrogate pair, convert to UTF32 first. */
        if (ch >= UNI_SUR_HIGH_START && ch <= UNI_SUR_HIGH_END) {
            /* If the 16 bits following the high surrogate are in the source buffer... */
            if (source < sourceEnd) {
                ch2 = *source;
                /* If it's a low surrogate, convert to UTF32. */
                if (ch2 >= UNI_SUR_LOW_START && ch2 <= UNI_SUR_LOW_END) {
                    ch = ((ch - UNI_SUR_HIGH_START) << halfShift)
                        + (ch2 - UNI_SUR_LOW_START) + halfBase;
                    ++source;
                } else if (flags == strictConversion) { /* it's an unpaired high surrogate */
                    --source; /* return to the illegal value itself */
                    result = sourceIllegal;
                    break;
                }
            } else { /* We don't have the 16 bits following the high surrogate. */
                --source; /* return to the high surrogate */
                result = sourceExhausted;
                break;
            }
        } else if (flags == strictConversion) {
            /* UTF-16 surrogate values are illegal in UTF-32 */
            if (ch >= UNI_SUR_LOW_START && ch <= UNI_SUR_LOW_END) {
                --source; /* return to the illegal value itself */
                result = sourceIllegal;
                break;
            }
        }
        if (target >= targetEnd) {
            source = oldSource; /* Back up source pointer! */
            result = targetExhausted; break;
        }
        *target++ = ch;
    }
    *sourceStart = source;
    *targetStart = target;
#ifdef CVTUTF_DEBUG
if (result == sourceIllegal) {
    fprintf(stderr, "ConvertUTF16toUTF32 illegal seq 0x%04x,%04x\n", ch, ch2);
    fflush(stderr);
}
#endif
    return result;
}